

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::ConvertMesh
          (BlenderImporter *this,Scene *param_1,Object *param_2,Mesh *mesh,ConversionData *conv_data
          ,TempArray<std::vector,_aiMesh> *temp)

{
  _Rb_tree_node_base *__k;
  char *pcVar1;
  key_type_conflict *__k_00;
  _Base_ptr *pp_Var2;
  _Rb_tree_header *p_Var3;
  pointer pMVar4;
  pointer pMVar5;
  pointer ppaVar6;
  aiMesh *paVar7;
  pointer psVar8;
  pointer psVar9;
  _Elt_pointer psVar10;
  _Map_pointer ppsVar11;
  pointer pMVar12;
  pointer pMVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pMVar14;
  pointer pMVar15;
  mapped_type pMVar16;
  pointer pMVar17;
  pointer pTVar18;
  pointer pTVar19;
  pointer pMVar20;
  pointer pMVar21;
  pointer pMVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  _Rb_tree_color _Var25;
  mapped_type_conflict3 *pmVar26;
  pointer pcVar27;
  ulong uVar28;
  aiVector3D *paVar29;
  ulong *puVar30;
  aiFace *paVar31;
  size_t sVar32;
  _Base_ptr p_Var33;
  uint *puVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  ElemBase *pEVar38;
  mapped_type *ppMVar39;
  aiColor4D *paVar40;
  aiFace *paVar41;
  _Base_ptr p_Var42;
  uint uVar43;
  long *plVar44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  aiVector3D *paVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  pointer ppaVar52;
  bool bVar53;
  MaterialTextureUVMappings matTexUvMappings;
  shared_ptr<Assimp::Blender::Material> mat;
  iterator has;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  mat_num_to_mesh_idx;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  per_mat;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  per_mat_verts;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
  local_538;
  value_type local_508;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
  local_4f8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  local_4c8;
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  local_498;
  undefined1 local_468 [8];
  undefined1 auStack_460 [1024];
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  local_60;
  
  if ((((long)mesh->totface != 0) || (mesh->totloop != 0)) && (mesh->totvert != 0)) {
    if ((ulong)(((long)(mesh->mface).
                       super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       .
                       super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(mesh->mface).
                       super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       .
                       super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) <
        (ulong)(long)mesh->totface) {
      local_468 = (undefined1  [8])(auStack_460 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Number of faces is larger than the corresponding array","");
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
      if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
        operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
      }
    }
    if ((ulong)(((long)(mesh->mvert).
                       super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       .
                       super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(mesh->mvert).
                       super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       .
                       super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) <
        (ulong)(long)mesh->totvert) {
      local_468 = (undefined1  [8])(auStack_460 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Number of vertices is larger than the corresponding array","")
      ;
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
      if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
        operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
      }
    }
    if ((ulong)(((long)(mesh->mloop).
                       super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       .
                       super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(mesh->mloop).
                       super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       .
                       super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
        (ulong)(long)mesh->totloop) {
      local_468 = (undefined1  [8])(auStack_460 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Number of vertices is larger than the corresponding array","")
      ;
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
      if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
        operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
      }
    }
    local_498._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_498._M_impl.super__Rb_tree_header._M_header;
    local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_498._M_impl.super__Rb_tree_header._M_header._M_right =
         local_498._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < mesh->totface) {
      lVar49 = 0x20;
      lVar51 = 0;
      do {
        pMVar4 = (mesh->mface).
                 super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
                 super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __k_00 = (key_type_conflict *)((long)&(pMVar4->super_ElemBase)._vptr_ElemBase + lVar49);
        pmVar26 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_498,__k_00);
        *pmVar26 = *pmVar26 + 1;
        iVar47 = *(int *)((long)pMVar4 + lVar49 + -4);
        pmVar26 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_60,__k_00);
        *pmVar26 = (*pmVar26 - (ulong)(iVar47 == 0)) + 4;
        lVar51 = lVar51 + 1;
        lVar49 = lVar49 + 0x28;
      } while (lVar51 < mesh->totface);
    }
    if (0 < mesh->totpoly) {
      lVar49 = 0x18;
      lVar51 = 0;
      do {
        pMVar5 = (mesh->mpoly).
                 super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                 super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_468._0_4_ = (int)*(short *)((long)&(pMVar5->super_ElemBase)._vptr_ElemBase + lVar49);
        pmVar26 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_498,(key_type_conflict *)local_468);
        *pmVar26 = *pmVar26 + 1;
        iVar47 = *(int *)((long)pMVar5 + lVar49 + -4);
        local_468._0_4_ = (int)*(short *)((long)&(pMVar5->super_ElemBase)._vptr_ElemBase + lVar49);
        pmVar26 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_60,(key_type_conflict *)local_468);
        *pmVar26 = *pmVar26 + (long)iVar47;
        lVar51 = lVar51 + 1;
        lVar49 = lVar49 + 0x20;
      } while (lVar51 < mesh->totpoly);
    }
    lVar49 = (long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&temp->arr,(lVar49 >> 3) + local_498._M_impl.super__Rb_tree_header._M_node_count);
    local_4c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_4c8._M_impl.super__Rb_tree_header._M_header;
    local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_4c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((_Rb_tree_header *)local_498._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_498._M_impl.super__Rb_tree_header) {
      pcVar1 = (mesh->id).name + 2;
      pp_Var2 = &local_538._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var33 = local_498._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        ppaVar52 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppaVar6 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_468 = (undefined1  [8])(long)(int)p_Var33[1]._M_color;
        pmVar26 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&local_4c8,(key_type_conflict1 *)local_468);
        *pmVar26 = (long)ppaVar6 - (long)ppaVar52 >> 3;
        pcVar27 = (pointer)operator_new(0x520);
        pcVar27[0] = '\0';
        pcVar27[1] = '\0';
        pcVar27[2] = '\0';
        pcVar27[3] = '\0';
        pcVar27[4] = '\0';
        pcVar27[5] = '\0';
        pcVar27[6] = '\0';
        pcVar27[7] = '\0';
        pcVar27[8] = '\0';
        pcVar27[9] = '\0';
        pcVar27[10] = '\0';
        pcVar27[0xb] = '\0';
        memset(pcVar27 + 0x10,0,0xcc);
        pcVar27[0xe0] = '\0';
        pcVar27[0xe1] = '\0';
        pcVar27[0xe2] = '\0';
        pcVar27[0xe3] = '\0';
        pcVar27[0xe4] = '\0';
        pcVar27[0xe5] = '\0';
        pcVar27[0xe6] = '\0';
        pcVar27[0xe7] = '\0';
        pcVar27[0xe8] = '\0';
        pcVar27[0xe9] = '\0';
        pcVar27[0xea] = '\0';
        pcVar27[0xeb] = '\0';
        pcVar27[0xec] = '\0';
        pcVar27[0xed] = '\0';
        pcVar27[0xee] = '\0';
        pcVar27[0xef] = '\0';
        pcVar27[0xf0] = '\0';
        memset(pcVar27 + 0xf1,0x1b,0x3ff);
        pcVar27[0x4f0] = '\0';
        pcVar27[0x4f1] = '\0';
        pcVar27[0x4f2] = '\0';
        pcVar27[0x4f3] = '\0';
        pcVar27[0x4f8] = '\0';
        pcVar27[0x4f9] = '\0';
        pcVar27[0x4fa] = '\0';
        pcVar27[0x4fb] = '\0';
        pcVar27[0x4fc] = '\0';
        pcVar27[0x4fd] = '\0';
        pcVar27[0x4fe] = '\0';
        pcVar27[0x4ff] = '\0';
        pcVar27[0x500] = '\0';
        pcVar27[0x501] = '\0';
        pcVar27[0x502] = '\0';
        pcVar27[0x503] = '\0';
        pcVar27[0x504] = '\0';
        pcVar27[0x505] = '\0';
        pcVar27[0x506] = '\0';
        pcVar27[0x507] = '\0';
        pcVar27[0x508] = '\0';
        pcVar27[0x509] = '\0';
        pcVar27[0x50a] = '\0';
        pcVar27[0x50b] = '\0';
        pcVar27[0x50c] = '\0';
        pcVar27[0x50d] = '\0';
        pcVar27[0x50e] = '\0';
        pcVar27[0x50f] = '\0';
        pcVar27[0x510] = '\0';
        pcVar27[0x511] = '\0';
        pcVar27[0x512] = '\0';
        pcVar27[0x513] = '\0';
        pcVar27[0x514] = '\0';
        pcVar27[0x515] = '\0';
        pcVar27[0x516] = '\0';
        pcVar27[0x517] = '\0';
        pcVar27[0x518] = '\0';
        pcVar27[0x519] = '\0';
        pcVar27[0x51a] = '\0';
        pcVar27[0x51b] = '\0';
        pcVar27[0x70] = '\0';
        pcVar27[0x71] = '\0';
        pcVar27[0x72] = '\0';
        pcVar27[0x73] = '\0';
        pcVar27[0x74] = '\0';
        pcVar27[0x75] = '\0';
        pcVar27[0x76] = '\0';
        pcVar27[0x77] = '\0';
        pcVar27[0x78] = '\0';
        pcVar27[0x79] = '\0';
        pcVar27[0x7a] = '\0';
        pcVar27[0x7b] = '\0';
        pcVar27[0x7c] = '\0';
        pcVar27[0x7d] = '\0';
        pcVar27[0x7e] = '\0';
        pcVar27[0x7f] = '\0';
        pcVar27[0x80] = '\0';
        pcVar27[0x81] = '\0';
        pcVar27[0x82] = '\0';
        pcVar27[0x83] = '\0';
        pcVar27[0x84] = '\0';
        pcVar27[0x85] = '\0';
        pcVar27[0x86] = '\0';
        pcVar27[0x87] = '\0';
        pcVar27[0x88] = '\0';
        pcVar27[0x89] = '\0';
        pcVar27[0x8a] = '\0';
        pcVar27[0x8b] = '\0';
        pcVar27[0x8c] = '\0';
        pcVar27[0x8d] = '\0';
        pcVar27[0x8e] = '\0';
        pcVar27[0x8f] = '\0';
        pcVar27[0x90] = '\0';
        pcVar27[0x91] = '\0';
        pcVar27[0x92] = '\0';
        pcVar27[0x93] = '\0';
        pcVar27[0x94] = '\0';
        pcVar27[0x95] = '\0';
        pcVar27[0x96] = '\0';
        pcVar27[0x97] = '\0';
        pcVar27[0x98] = '\0';
        pcVar27[0x99] = '\0';
        pcVar27[0x9a] = '\0';
        pcVar27[0x9b] = '\0';
        pcVar27[0x9c] = '\0';
        pcVar27[0x9d] = '\0';
        pcVar27[0x9e] = '\0';
        pcVar27[0x9f] = '\0';
        pcVar27[0xa0] = '\0';
        pcVar27[0xa1] = '\0';
        pcVar27[0xa2] = '\0';
        pcVar27[0xa3] = '\0';
        pcVar27[0xa4] = '\0';
        pcVar27[0xa5] = '\0';
        pcVar27[0xa6] = '\0';
        pcVar27[0xa7] = '\0';
        pcVar27[0xa8] = '\0';
        pcVar27[0xa9] = '\0';
        pcVar27[0xaa] = '\0';
        pcVar27[0xab] = '\0';
        pcVar27[0xac] = '\0';
        pcVar27[0xad] = '\0';
        pcVar27[0xae] = '\0';
        pcVar27[0xaf] = '\0';
        pcVar27[0xb0] = '\0';
        pcVar27[0xb1] = '\0';
        pcVar27[0xb2] = '\0';
        pcVar27[0xb3] = '\0';
        pcVar27[0xb4] = '\0';
        pcVar27[0xb5] = '\0';
        pcVar27[0xb6] = '\0';
        pcVar27[0xb7] = '\0';
        pcVar27[0xb8] = '\0';
        pcVar27[0xb9] = '\0';
        pcVar27[0xba] = '\0';
        pcVar27[0xbb] = '\0';
        pcVar27[0xbc] = '\0';
        pcVar27[0xbd] = '\0';
        pcVar27[0xbe] = '\0';
        pcVar27[0xbf] = '\0';
        pcVar27[0xc0] = '\0';
        pcVar27[0xc1] = '\0';
        pcVar27[0xc2] = '\0';
        pcVar27[0xc3] = '\0';
        pcVar27[0xc4] = '\0';
        pcVar27[0xc5] = '\0';
        pcVar27[0xc6] = '\0';
        pcVar27[199] = '\0';
        pcVar27[200] = '\0';
        pcVar27[0xc9] = '\0';
        pcVar27[0xca] = '\0';
        pcVar27[0xcb] = '\0';
        pcVar27[0xcc] = '\0';
        pcVar27[0xcd] = '\0';
        pcVar27[0xce] = '\0';
        pcVar27[0xcf] = '\0';
        pcVar27[0x30] = '\0';
        pcVar27[0x31] = '\0';
        pcVar27[0x32] = '\0';
        pcVar27[0x33] = '\0';
        pcVar27[0x34] = '\0';
        pcVar27[0x35] = '\0';
        pcVar27[0x36] = '\0';
        pcVar27[0x37] = '\0';
        pcVar27[0x38] = '\0';
        pcVar27[0x39] = '\0';
        pcVar27[0x3a] = '\0';
        pcVar27[0x3b] = '\0';
        pcVar27[0x3c] = '\0';
        pcVar27[0x3d] = '\0';
        pcVar27[0x3e] = '\0';
        pcVar27[0x3f] = '\0';
        pcVar27[0x40] = '\0';
        pcVar27[0x41] = '\0';
        pcVar27[0x42] = '\0';
        pcVar27[0x43] = '\0';
        pcVar27[0x44] = '\0';
        pcVar27[0x45] = '\0';
        pcVar27[0x46] = '\0';
        pcVar27[0x47] = '\0';
        pcVar27[0x48] = '\0';
        pcVar27[0x49] = '\0';
        pcVar27[0x4a] = '\0';
        pcVar27[0x4b] = '\0';
        pcVar27[0x4c] = '\0';
        pcVar27[0x4d] = '\0';
        pcVar27[0x4e] = '\0';
        pcVar27[0x4f] = '\0';
        pcVar27[0x50] = '\0';
        pcVar27[0x51] = '\0';
        pcVar27[0x52] = '\0';
        pcVar27[0x53] = '\0';
        pcVar27[0x54] = '\0';
        pcVar27[0x55] = '\0';
        pcVar27[0x56] = '\0';
        pcVar27[0x57] = '\0';
        pcVar27[0x58] = '\0';
        pcVar27[0x59] = '\0';
        pcVar27[0x5a] = '\0';
        pcVar27[0x5b] = '\0';
        pcVar27[0x5c] = '\0';
        pcVar27[0x5d] = '\0';
        pcVar27[0x5e] = '\0';
        pcVar27[0x5f] = '\0';
        pcVar27[0x60] = '\0';
        pcVar27[0x61] = '\0';
        pcVar27[0x62] = '\0';
        pcVar27[99] = '\0';
        pcVar27[100] = '\0';
        pcVar27[0x65] = '\0';
        pcVar27[0x66] = '\0';
        pcVar27[0x67] = '\0';
        pcVar27[0x68] = '\0';
        pcVar27[0x69] = '\0';
        pcVar27[0x6a] = '\0';
        pcVar27[0x6b] = '\0';
        pcVar27[0x6c] = '\0';
        pcVar27[0x6d] = '\0';
        pcVar27[0x6e] = '\0';
        pcVar27[0x6f] = '\0';
        local_468 = (undefined1  [8])pcVar27;
        std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                  ((vector<aiMesh*,std::allocator<aiMesh*>> *)temp,(aiMesh **)local_468);
        __k = p_Var33 + 1;
        paVar7 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
        pmVar26 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_60,(key_type_conflict *)__k);
        uVar37 = *pmVar26;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar37;
        uVar28 = SUB168(auVar23 * ZEXT816(0xc),0);
        if (SUB168(auVar23 * ZEXT816(0xc),8) != 0) {
          uVar28 = 0xffffffffffffffff;
        }
        paVar29 = (aiVector3D *)operator_new__(uVar28);
        if (uVar37 != 0) {
          memset(paVar29,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar7->mVertices = paVar29;
        pmVar26 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_60,(key_type_conflict *)__k);
        uVar37 = *pmVar26;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar37;
        uVar28 = SUB168(auVar24 * ZEXT816(0xc),0);
        if (SUB168(auVar24 * ZEXT816(0xc),8) != 0) {
          uVar28 = 0xffffffffffffffff;
        }
        paVar29 = (aiVector3D *)operator_new__(uVar28);
        if (uVar37 != 0) {
          memset(paVar29,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar7->mNormals = paVar29;
        p_Var42 = p_Var33[1]._M_parent;
        puVar30 = (ulong *)operator_new__(-(ulong)((ulong)p_Var42 >> 0x3c != 0) |
                                          (long)p_Var42 * 0x10 | 8);
        *puVar30 = (ulong)p_Var42;
        paVar31 = (aiFace *)(puVar30 + 1);
        if (p_Var42 != (_Base_ptr)0x0) {
          paVar41 = paVar31;
          do {
            paVar41->mNumIndices = 0;
            paVar41->mIndices = (uint *)0x0;
            paVar41 = paVar41 + 1;
          } while (paVar41 != paVar31 + (long)p_Var42);
        }
        paVar7->mFaces = paVar31;
        local_538._M_impl._0_8_ = pp_Var2;
        sVar32 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,pcVar1,pcVar1 + sVar32)
        ;
        uVar37 = (ulong)local_538._M_impl.super__Rb_tree_header._M_header._M_color;
        if ((local_538._M_impl.super__Rb_tree_header._M_header._M_color & 0xfffffc00) != _S_red) {
          uVar37 = 0x3ff;
        }
        local_468._0_4_ = (ai_uint32)uVar37;
        memcpy(local_468 + 4,(void *)local_538._M_impl._0_8_,uVar37);
        local_468[uVar37 + 4] = 0;
        (paVar7->mName).length = (ai_uint32)uVar37;
        memcpy((paVar7->mName).data,local_468 + 4,uVar37);
        (paVar7->mName).data[uVar37] = '\0';
        if ((_Base_ptr *)local_538._M_impl._0_8_ != pp_Var2) {
          operator_delete((void *)local_538._M_impl._0_8_,
                          (ulong)((long)&((__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                                           *)&(local_538._M_impl.super__Rb_tree_header._M_header.
                                              _M_parent)->_M_color)->_M_ptr + 1));
        }
        psVar8 = (mesh->mat).
                 super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 .
                 super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar9 = (mesh->mat).
                 super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 .
                 super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar8 == psVar9) {
          paVar7->mMaterialIndex = 0xffffffff;
        }
        else {
          if ((ulong)((long)psVar9 - (long)psVar8 >> 4) <= (ulong)(long)(int)__k->_M_color) {
            local_468 = (undefined1  [8])(auStack_460 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_468,"Material index is out of range","");
            LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
            if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
              operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
            }
          }
          psVar8 = (mesh->mat).
                   super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                   .
                   super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = psVar8[(int)__k->_M_color].
                 super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               psVar8[(int)__k->_M_color].
               super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
          if (local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_508.
                    super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_508.
                    super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_468 = (undefined1  [8])
                      (conv_data->materials_raw).
                      super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur;
          auStack_460._0_8_ =
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
          auStack_460._8_4_ =
               *(undefined4 *)
                &(conv_data->materials_raw).
                 super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
          auStack_460._12_4_ =
               *(undefined4 *)
                ((long)&(conv_data->materials_raw).
                        super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last + 4);
          auStack_460._16_4_ =
               *(undefined4 *)
                &(conv_data->materials_raw).
                 super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
          auStack_460._20_4_ =
               *(undefined4 *)
                ((long)&(conv_data->materials_raw).
                        super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
          local_538._M_impl._0_8_ =
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_538._M_impl.super__Rb_tree_header._M_header._M_color =
               *(_Rb_tree_color *)
                &(conv_data->materials_raw).
                 super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
          local_538._M_impl.super__Rb_tree_header._M_header._4_4_ =
               *(undefined4 *)
                ((long)&(conv_data->materials_raw).
                        super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first + 4);
          local_538._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last;
          local_538._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
          std::
          __find_if<std::_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,std::shared_ptr<Assimp::Blender::Material>&,std::shared_ptr<Assimp::Blender::Material>*>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Assimp::Blender::Material>const>>
                    (&local_4f8,(string *)local_468,&local_538,&local_508);
          psVar10 = (conv_data->materials_raw).
                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if ((_Elt_pointer)local_4f8._M_impl._0_8_ == psVar10) {
            ppsVar11 = (conv_data->materials_raw).
                       super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node;
            paVar7->mMaterialIndex =
                 (int)((ulong)((long)(conv_data->materials_raw).
                                     super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last -
                              (long)(conv_data->materials_raw).
                                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) +
                 (int)((ulong)((long)psVar10 -
                              (long)(conv_data->materials_raw).
                                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) +
                 ((((uint)((int)ppsVar11 -
                          *(int *)&(conv_data->materials_raw).
                                   super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                 (uint)(ppsVar11 == (_Map_pointer)0x0)) * 0x20;
            std::
            deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
            ::push_back(&conv_data->materials_raw,&local_508);
          }
          else {
            paVar7->mMaterialIndex =
                 (int)((ulong)(local_4f8._M_impl._0_8_ -
                              CONCAT44(local_4f8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                       local_4f8._M_impl.super__Rb_tree_header._M_header._M_color))
                      >> 4) +
                 (int)((ulong)((long)(conv_data->materials_raw).
                                     super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last -
                              (long)(conv_data->materials_raw).
                                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) +
                 ((((uint)((int)local_4f8._M_impl.super__Rb_tree_header._M_header._M_left -
                          *(int *)&(conv_data->materials_raw).
                                   super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                 (uint)(local_4f8._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0)
                 ) * 0x20;
          }
          if (local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_508.
                       super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        p_Var33 = (_Base_ptr)std::_Rb_tree_increment(p_Var33);
      } while ((_Rb_tree_header *)p_Var33 != &local_498._M_impl.super__Rb_tree_header);
    }
    if (0 < mesh->totface) {
      lVar51 = 0x20;
      lVar50 = 0;
      do {
        pMVar4 = (mesh->mface).
                 super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
                 super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_468 = (undefined1  [8])
                    (long)*(int *)((long)&(pMVar4->super_ElemBase)._vptr_ElemBase + lVar51);
        pmVar26 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&local_4c8,(key_type_conflict1 *)local_468);
        paVar7 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start[*pmVar26];
        paVar31 = paVar7->mFaces;
        uVar43 = paVar7->mNumFaces;
        paVar7->mNumFaces = uVar43 + 1;
        uVar45 = 4 - (*(int *)((long)pMVar4 + lVar51 + -4) == 0);
        paVar31[uVar43].mNumIndices = uVar45;
        puVar34 = (uint *)operator_new__((ulong)(uVar45 * 4));
        paVar31[uVar43].mIndices = puVar34;
        paVar29 = paVar7->mVertices + paVar7->mNumVertices;
        paVar48 = paVar7->mNormals + paVar7->mNumVertices;
        if (mesh->totvert <= *(int *)((long)pMVar4 + lVar51 + -0x10)) {
          local_468 = (undefined1  [8])(auStack_460 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Vertex index v1 out of range","");
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
          if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
            operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
          }
        }
        iVar47 = *(int *)((long)pMVar4 + lVar51 + -0x10);
        pMVar12 = (mesh->mvert).
                  super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                  super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar29->x = pMVar12[iVar47].co[0];
        paVar29->y = pMVar12[iVar47].co[1];
        paVar29->z = pMVar12[iVar47].co[2];
        paVar48->x = pMVar12[iVar47].no[0];
        paVar48->y = pMVar12[iVar47].no[1];
        paVar48->z = pMVar12[iVar47].no[2];
        uVar45 = paVar7->mNumVertices;
        paVar7->mNumVertices = uVar45 + 1;
        *paVar31[uVar43].mIndices = uVar45;
        if (mesh->totvert <= *(int *)((long)pMVar4 + lVar51 + -0xc)) {
          local_468 = (undefined1  [8])(auStack_460 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Vertex index v2 out of range","");
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
          if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
            operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
          }
        }
        iVar47 = *(int *)((long)pMVar4 + lVar51 + -0xc);
        pMVar12 = (mesh->mvert).
                  super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                  super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar29[1].x = pMVar12[iVar47].co[0];
        paVar29[1].y = pMVar12[iVar47].co[1];
        paVar29[1].z = pMVar12[iVar47].co[2];
        paVar48[1].x = pMVar12[iVar47].no[0];
        paVar48[1].y = pMVar12[iVar47].no[1];
        paVar48[1].z = pMVar12[iVar47].no[2];
        uVar45 = paVar7->mNumVertices;
        paVar7->mNumVertices = uVar45 + 1;
        paVar31[uVar43].mIndices[1] = uVar45;
        if (mesh->totvert <= *(int *)((long)pMVar4 + lVar51 + -8)) {
          local_468 = (undefined1  [8])(auStack_460 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Vertex index v3 out of range","");
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
          if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
            operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
          }
        }
        iVar47 = *(int *)((long)pMVar4 + lVar51 + -8);
        pMVar12 = (mesh->mvert).
                  super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                  super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar29[2].x = pMVar12[iVar47].co[0];
        paVar29[2].y = pMVar12[iVar47].co[1];
        paVar29[2].z = pMVar12[iVar47].co[2];
        paVar48[2].x = pMVar12[iVar47].no[0];
        paVar48[2].y = pMVar12[iVar47].no[1];
        paVar48[2].z = pMVar12[iVar47].no[2];
        uVar45 = paVar7->mNumVertices;
        paVar7->mNumVertices = uVar45 + 1;
        paVar31[uVar43].mIndices[2] = uVar45;
        if (mesh->totvert <= *(int *)((long)pMVar4 + lVar51 + -4)) {
          local_468 = (undefined1  [8])(auStack_460 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Vertex index v4 out of range","");
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
          if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
            operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
          }
        }
        lVar35 = (long)*(int *)((long)pMVar4 + lVar51 + -4);
        if (lVar35 == 0) {
          uVar43 = 4;
        }
        else {
          pMVar12 = (mesh->mvert).
                    super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                    super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar29[3].x = pMVar12[lVar35].co[0];
          paVar29[3].y = pMVar12[lVar35].co[1];
          paVar29[3].z = pMVar12[lVar35].co[2];
          paVar48[3].x = pMVar12[lVar35].no[0];
          paVar48[3].y = pMVar12[lVar35].no[1];
          paVar48[3].z = pMVar12[lVar35].no[2];
          uVar45 = paVar7->mNumVertices;
          paVar7->mNumVertices = uVar45 + 1;
          paVar31[uVar43].mIndices[3] = uVar45;
          uVar43 = 8;
        }
        paVar7->mPrimitiveTypes = paVar7->mPrimitiveTypes | uVar43;
        lVar50 = lVar50 + 1;
        lVar51 = lVar51 + 0x28;
      } while (lVar50 < mesh->totface);
    }
    if (0 < mesh->totpoly) {
      lVar51 = 0;
      do {
        pMVar5 = (mesh->mpoly).
                 super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                 super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_468 = (undefined1  [8])(long)pMVar5[lVar51].mat_nr;
        pmVar26 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&local_4c8,(key_type_conflict1 *)local_468);
        paVar7 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start[*pmVar26];
        paVar31 = paVar7->mFaces;
        uVar43 = paVar7->mNumFaces;
        paVar7->mNumFaces = uVar43 + 1;
        uVar45 = pMVar5[lVar51].totloop;
        paVar31[uVar43].mNumIndices = uVar45;
        puVar34 = (uint *)operator_new__((ulong)uVar45 << 2);
        paVar31[uVar43].mIndices = puVar34;
        if (pMVar5[lVar51].totloop < 1) {
LAB_004e3bcc:
          uVar43 = 8;
        }
        else {
          paVar29 = paVar7->mNormals;
          paVar48 = paVar7->mVertices;
          lVar50 = (ulong)paVar7->mNumVertices * 0xc;
          lVar35 = 0;
          do {
            lVar36 = pMVar5[lVar51].loopstart + lVar35;
            pMVar13 = (mesh->mloop).
                      super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>.
                      super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (mesh->totvert <= pMVar13[lVar36].v) {
              local_468 = (undefined1  [8])(auStack_460 + 8);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_468,"Vertex index out of range","");
              LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
              if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
                operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1
                               );
              }
            }
            iVar47 = pMVar13[lVar36].v;
            pMVar12 = (mesh->mvert).
                      super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                      super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(float *)((long)&paVar48->x + lVar50) = pMVar12[iVar47].co[0];
            *(float *)((long)&paVar48->y + lVar50) = pMVar12[iVar47].co[1];
            *(float *)((long)&paVar48->z + lVar50) = pMVar12[iVar47].co[2];
            *(float *)((long)&paVar29->x + lVar50) = pMVar12[iVar47].no[0];
            *(float *)((long)&paVar29->y + lVar50) = pMVar12[iVar47].no[1];
            *(float *)((long)&paVar29->z + lVar50) = pMVar12[iVar47].no[2];
            uVar45 = paVar7->mNumVertices;
            paVar7->mNumVertices = uVar45 + 1;
            paVar31[uVar43].mIndices[lVar35] = uVar45;
            lVar35 = lVar35 + 1;
            lVar50 = lVar50 + 0xc;
          } while (lVar35 < pMVar5[lVar51].totloop);
          uVar43 = 4;
          if (pMVar5[lVar51].totloop != 3) goto LAB_004e3bcc;
        }
        paVar7->mPrimitiveTypes = paVar7->mPrimitiveTypes | uVar43;
        lVar51 = lVar51 + 1;
      } while (lVar51 < mesh->totpoly);
    }
    local_538._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_538._M_impl.super__Rb_tree_header._M_header;
    local_538._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_538._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_538._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar37 = (ulong)((long)(mesh->mat).
                           super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                           .
                           super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(mesh->mat).
                          super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                          .
                          super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    local_538._M_impl.super__Rb_tree_header._M_header._M_right =
         local_538._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((int)uVar37 != 0) {
      uVar28 = 0;
      do {
        psVar8 = (mesh->mat).
                 super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 .
                 super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar51 = (long)psVar8[uVar28].
                       super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
        this_00 = psVar8[uVar28].
                  super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_4f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_4f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_4f8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_4f8._M_impl.super__Rb_tree_header._M_header;
        local_4f8._M_impl.super__Rb_tree_header._M_node_count = 0;
        plVar44 = (long *)(lVar51 + 0x598);
        lVar51 = 0;
        local_4f8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_4f8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if ((*plVar44 != 0) && (*(char *)(*plVar44 + 0x38) != '\0')) {
            lVar50 = *plVar44;
            pcVar1 = (char *)(lVar50 + 0x38);
            local_468 = (undefined1  [8])(auStack_460 + 8);
            sVar32 = strlen(pcVar1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_468,pcVar1,lVar50 + sVar32 + 0x38);
            pEVar38 = Blender::getCustomDataLayerData(&mesh->ldata,CD_MLOOPUV,(string *)local_468);
            if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
              operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
            }
            if (pEVar38 != (ElemBase *)0x0) {
              auStack_460._0_8_ =
                   __dynamic_cast(pEVar38,&Blender::ElemBase::typeinfo,&Blender::MLoopUV::typeinfo,0
                                 );
              local_468._0_4_ = (int)lVar51;
              std::
              _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>
              ::_M_emplace_unique<std::pair<unsigned_int,Assimp::Blender::MLoopUV_const*>>
                        ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>
                          *)&local_4f8,
                         (pair<unsigned_int,_const_Assimp::Blender::MLoopUV_*> *)local_468);
            }
          }
          lVar51 = lVar51 + 1;
          plVar44 = plVar44 + 2;
        } while (lVar51 != 0x12);
        if (local_4f8._M_impl.super__Rb_tree_header._M_node_count != 0) {
          local_468._0_4_ = (int)uVar28;
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
          ::_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                      *)auStack_460,&local_4f8);
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_int,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>>
                      *)&local_538,
                     (pair<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>
                      *)local_468);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                       *)auStack_460);
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
        ::~_Rb_tree(&local_4f8);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != (uVar37 & 0xffffffff));
    }
    pMVar14 = (mesh->mtface).
              super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
              super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar15 = (mesh->mtface).
              super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
              super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pMVar14 != pMVar15) ||
       ((mesh->mloopuv).
        super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (mesh->mloopuv).
        super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      if ((int)((ulong)((long)pMVar15 - (long)pMVar14) >> 3) * -0x49249249 < mesh->totface) {
        local_468 = (undefined1  [8])(auStack_460 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_468,
                   "Number of UV faces is larger than the corresponding UV face array (#1)","");
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
        if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
          operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
        }
      }
      ppaVar52 = (pointer)((long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar49);
      if (ppaVar52 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          paVar7 = *ppaVar52;
          uVar43 = paVar7->mNumVertices;
          if ((uVar43 == 0) || (paVar7->mNumFaces == 0)) {
            __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                          ,0x423,
                          "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                         );
          }
          p_Var3 = &local_538._M_impl.super__Rb_tree_header;
          p_Var33 = &p_Var3->_M_header;
          if (local_538._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var42 = local_538._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              bVar53 = p_Var42[1]._M_color < paVar7->mMaterialIndex;
              if (!bVar53) {
                p_Var33 = p_Var42;
              }
              p_Var42 = (&p_Var42->_M_left)[bVar53];
            } while (p_Var42 != (_Base_ptr)0x0);
          }
          p_Var42 = &p_Var3->_M_header;
          if (((_Rb_tree_header *)p_Var33 != p_Var3) &&
             (p_Var42 = p_Var33, paVar7->mMaterialIndex < p_Var33[1]._M_color)) {
            p_Var42 = &p_Var3->_M_header;
          }
          if ((_Rb_tree_header *)p_Var42 == p_Var3) {
            paVar29 = (aiVector3D *)operator_new__((ulong)uVar43 * 0xc);
            memset(paVar29,0,(((ulong)uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            (*ppaVar52)->mTextureCoords[0] = paVar29;
          }
          else if (p_Var42[2]._M_left != (_Base_ptr)0x0) {
            uVar43 = 1;
            p_Var33 = (_Base_ptr)0x0;
            do {
              uVar37 = (ulong)(*ppaVar52)->mNumVertices;
              paVar29 = (aiVector3D *)operator_new__(uVar37 * 0xc);
              if (uVar37 != 0) {
                memset(paVar29,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              (*ppaVar52)->mTextureCoords[(long)p_Var33] = paVar29;
              p_Var33 = (_Base_ptr)(ulong)uVar43;
              uVar43 = uVar43 + 1;
            } while (p_Var33 < p_Var42[2]._M_left);
          }
          (*ppaVar52)->mNumVertices = 0;
          (*ppaVar52)->mNumFaces = 0;
          ppaVar52 = ppaVar52 + 1;
        } while (ppaVar52 !=
                 (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (0 < mesh->totface) {
        lVar51 = 0x14;
        lVar50 = 0;
        do {
          pMVar14 = (mesh->mtface).
                    super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
                    super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_468 = (undefined1  [8])
                      (long)(mesh->mface).
                            super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            .
                            super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar50].mat_nr;
          pmVar26 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar7 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar26];
          paVar31 = paVar7->mFaces;
          uVar43 = paVar7->mNumFaces;
          paVar7->mNumFaces = uVar43 + 1;
          if (paVar31[uVar43].mNumIndices != 0) {
            paVar29 = paVar7->mTextureCoords[0] + paVar7->mNumVertices;
            uVar37 = 0;
            do {
              paVar29->x = *(float *)((long)(pMVar14->uv + uVar37 + 0xfffffffffffffffd) + 4U +
                                     lVar51);
              paVar29->y = *(float *)((long)(pMVar14->uv + uVar37 + 0xfffffffffffffffe) + lVar51);
              paVar7->mNumVertices = paVar7->mNumVertices + 1;
              uVar37 = uVar37 + 1;
              paVar29 = paVar29 + 1;
            } while (uVar37 < paVar31[uVar43].mNumIndices);
          }
          lVar50 = lVar50 + 1;
          lVar51 = lVar51 + 0x38;
        } while (lVar50 < mesh->totface);
      }
      if (0 < mesh->totpoly) {
        lVar51 = 0;
        do {
          pMVar5 = (mesh->mpoly).
                   super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                   super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_468 = (undefined1  [8])(long)pMVar5[lVar51].mat_nr;
          pmVar26 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar7 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar26];
          uVar43 = paVar7->mNumFaces;
          paVar7->mNumFaces = uVar43 + 1;
          _Var25 = (_Rb_tree_color)pMVar5[lVar51].mat_nr;
          p_Var33 = &local_538._M_impl.super__Rb_tree_header._M_header;
          for (p_Var42 = local_538._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var42 != (_Base_ptr)0x0; p_Var42 = (&p_Var42->_M_left)[bVar53]) {
            bVar53 = p_Var42[1]._M_color < _Var25;
            if (!bVar53) {
              p_Var33 = p_Var42;
            }
          }
          p_Var3 = &local_538._M_impl.super__Rb_tree_header;
          p_Var42 = &p_Var3->_M_header;
          if (((_Rb_tree_header *)p_Var33 != p_Var3) &&
             (p_Var42 = p_Var33, _Var25 < p_Var33[1]._M_color)) {
            p_Var42 = &p_Var3->_M_header;
          }
          paVar31 = paVar7->mFaces + uVar43;
          if ((_Rb_tree_header *)p_Var42 == p_Var3) {
            if (paVar31->mNumIndices != 0) {
              paVar29 = paVar7->mTextureCoords[0] + paVar7->mNumVertices;
              uVar43 = 0;
              do {
                uVar45 = pMVar5[lVar51].loopstart + uVar43;
                pMVar17 = (mesh->mloopuv).
                          super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>
                          .
                          super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                paVar29->x = pMVar17[uVar45].uv[0];
                paVar29->y = pMVar17[uVar45].uv[1];
                paVar7->mNumVertices = paVar7->mNumVertices + 1;
                uVar43 = uVar43 + 1;
                paVar29 = paVar29 + 1;
              } while (uVar43 < paVar31->mNumIndices);
            }
          }
          else {
            local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffff00000000);
            if (p_Var42[2]._M_left != (_Base_ptr)0x0) {
              do {
                ppMVar39 = std::
                           map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                           ::operator[]((map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                                         *)&p_Var42[1]._M_parent,(key_type *)local_468);
                if (paVar31->mNumIndices == 0) {
                  uVar43 = 0;
                }
                else {
                  pMVar16 = *ppMVar39;
                  lVar50 = (long)paVar7->mTextureCoords[(ulong)local_468 & 0xffffffff] +
                           (ulong)paVar7->mNumVertices * 0xc;
                  uVar43 = 0;
                  do {
                    uVar45 = pMVar5[lVar51].loopstart + uVar43;
                    *(float *)lVar50 = pMVar16[uVar45].uv[0];
                    *(float *)(lVar50 + 4) = pMVar16[uVar45].uv[1];
                    uVar43 = uVar43 + 1;
                    lVar50 = lVar50 + 0xc;
                  } while (uVar43 < paVar31->mNumIndices);
                }
                if ((undefined1 *)((long)&p_Var42[2]._M_left[-1]._M_right + 7U) ==
                    (undefined1 *)((ulong)local_468 & 0xffffffff)) {
                  paVar7->mNumVertices = paVar7->mNumVertices + uVar43;
                }
                uVar43 = local_468._0_4_ + 1;
                local_468._0_4_ = uVar43;
              } while ((_Base_ptr)(ulong)uVar43 < p_Var42[2]._M_left);
            }
          }
          lVar51 = lVar51 + 1;
        } while (lVar51 < mesh->totpoly);
      }
    }
    pTVar18 = (mesh->tface).
              super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar19 = (mesh->tface).
              super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar18 != pTVar19) {
      if ((int)((ulong)((long)pTVar19 - (long)pTVar18) >> 3) * 0x38e38e39 < mesh->totface) {
        local_468 = (undefined1  [8])(auStack_460 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_468,
                   "Number of faces is larger than the corresponding UV face array (#2)","");
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
        if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
          operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
        }
      }
      ppaVar52 = (pointer)((long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar49);
      if (ppaVar52 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          uVar43 = (*ppaVar52)->mNumVertices;
          if ((uVar43 == 0) || ((*ppaVar52)->mNumFaces == 0)) {
            __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                          ,0x469,
                          "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                         );
          }
          paVar29 = (aiVector3D *)operator_new__((ulong)uVar43 * 0xc);
          memset(paVar29,0,(((ulong)uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          (*ppaVar52)->mTextureCoords[0] = paVar29;
          (*ppaVar52)->mNumVertices = 0;
          (*ppaVar52)->mNumFaces = 0;
          ppaVar52 = ppaVar52 + 1;
        } while (ppaVar52 !=
                 (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (0 < mesh->totface) {
        lVar51 = 0x14;
        lVar50 = 0;
        do {
          pTVar18 = (mesh->tface).
                    super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
                    super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_468 = (undefined1  [8])
                      (long)(mesh->mface).
                            super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            .
                            super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar50].mat_nr;
          pmVar26 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar7 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar26];
          paVar31 = paVar7->mFaces;
          uVar43 = paVar7->mNumFaces;
          paVar7->mNumFaces = uVar43 + 1;
          if (paVar31[uVar43].mNumIndices != 0) {
            paVar29 = paVar7->mTextureCoords[0] + paVar7->mNumVertices;
            uVar37 = 0;
            do {
              paVar29->x = *(float *)((long)(pTVar18->uv + uVar37 + 0xfffffffffffffffd) + 4U +
                                     lVar51);
              paVar29->y = *(float *)((long)(pTVar18->uv + uVar37 + 0xfffffffffffffffe) + lVar51);
              paVar7->mNumVertices = paVar7->mNumVertices + 1;
              uVar37 = uVar37 + 1;
              paVar29 = paVar29 + 1;
            } while (uVar37 < paVar31[uVar43].mNumIndices);
          }
          lVar50 = lVar50 + 1;
          lVar51 = lVar51 + 0x48;
        } while (lVar50 < mesh->totface);
      }
    }
    pMVar20 = (mesh->mcol).
              super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar21 = (mesh->mcol).
              super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pMVar20 != pMVar21) ||
       ((mesh->mloopcol).
        super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (mesh->mloopcol).
        super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      if ((int)(((ulong)((long)pMVar21 - (long)pMVar20) >> 3) * -0x5555555555555555 >> 2) <
          mesh->totface) {
        local_468 = (undefined1  [8])(auStack_460 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_468,
                   "Number of faces is larger than the corresponding color face array","");
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
        if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
          operator_delete((void *)local_468,CONCAT44(auStack_460._12_4_,auStack_460._8_4_) + 1);
        }
      }
      ppaVar52 = (pointer)(lVar49 + (long)(temp->arr).
                                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
      if (ppaVar52 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          uVar37 = (ulong)(*ppaVar52)->mNumVertices;
          if ((uVar37 == 0) || ((*ppaVar52)->mNumFaces == 0)) {
            __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                          ,0x483,
                          "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                         );
          }
          uVar37 = uVar37 << 4;
          paVar40 = (aiColor4D *)operator_new__(uVar37);
          memset(paVar40,0,uVar37);
          (*ppaVar52)->mColors[0] = paVar40;
          (*ppaVar52)->mNumVertices = 0;
          (*ppaVar52)->mNumFaces = 0;
          ppaVar52 = ppaVar52 + 1;
        } while (ppaVar52 !=
                 (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (0 < mesh->totface) {
        iVar47 = 0;
        lVar49 = 0;
        do {
          local_468 = (undefined1  [8])
                      (long)(mesh->mface).
                            super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            .
                            super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar49].mat_nr;
          pmVar26 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar7 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar26];
          paVar31 = paVar7->mFaces;
          uVar43 = paVar7->mNumFaces;
          paVar7->mNumFaces = uVar43 + 1;
          if (paVar31[uVar43].mNumIndices != 0) {
            paVar40 = paVar7->mColors[0] + paVar7->mNumVertices;
            uVar37 = 0;
            do {
              uVar45 = iVar47 + (int)uVar37;
              pMVar20 = (mesh->mcol).
                        super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
                        super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              paVar40->r = (float)(int)pMVar20[uVar45].r;
              paVar40->g = (float)(int)pMVar20[uVar45].g;
              paVar40->b = (float)(int)pMVar20[uVar45].b;
              paVar40->a = (float)(int)pMVar20[uVar45].a;
              paVar7->mNumVertices = paVar7->mNumVertices + 1;
              uVar37 = uVar37 + 1;
              paVar40 = paVar40 + 1;
            } while (uVar37 < paVar31[uVar43].mNumIndices);
          }
          lVar49 = lVar49 + 1;
          iVar47 = iVar47 + 4;
        } while (lVar49 < mesh->totface);
      }
      if (0 < mesh->totpoly) {
        lVar49 = 0;
        do {
          pMVar5 = (mesh->mpoly).
                   super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                   super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_468 = (undefined1  [8])(long)pMVar5[lVar49].mat_nr;
          pmVar26 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar7 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar26];
          paVar31 = paVar7->mFaces;
          uVar43 = paVar7->mNumFaces;
          paVar7->mNumFaces = uVar43 + 1;
          if (paVar31[uVar43].mNumIndices != 0) {
            paVar40 = paVar7->mColors[0] + paVar7->mNumVertices;
            uVar45 = 0;
            do {
              uVar46 = pMVar5[lVar49].loopstart + uVar45;
              pMVar22 = (mesh->mloopcol).
                        super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>
                        .
                        super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              paVar40->r = (float)pMVar22[uVar46].r * 0.003921569;
              paVar40->g = (float)pMVar22[uVar46].g * 0.003921569;
              paVar40->b = (float)pMVar22[uVar46].b * 0.003921569;
              paVar40->a = (float)pMVar22[uVar46].a * 0.003921569;
              paVar7->mNumVertices = paVar7->mNumVertices + 1;
              uVar45 = uVar45 + 1;
              paVar40 = paVar40 + 1;
            } while (uVar45 < paVar31[uVar43].mNumIndices);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 < mesh->totpoly);
      }
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
    ::~_Rb_tree(&local_538);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~_Rb_tree(&local_4c8);
    std::
    _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::~_Rb_tree(&local_498);
  }
  return;
}

Assistant:

void BlenderImporter::ConvertMesh(const Scene& /*in*/, const Object* /*obj*/, const Mesh* mesh,
    ConversionData& conv_data, TempArray<std::vector,aiMesh>&  temp
    )
{
    // TODO: Resolve various problems with BMesh triangulation before re-enabling.
    //       See issues #400, #373, #318  #315 and #132.
#if defined(TODO_FIX_BMESH_CONVERSION)
    BlenderBMeshConverter BMeshConverter( mesh );
    if ( BMeshConverter.ContainsBMesh( ) )
    {
        mesh = BMeshConverter.TriangulateBMesh( );
    }
#endif

    typedef std::pair<const int,size_t> MyPair;
    if ((!mesh->totface && !mesh->totloop) || !mesh->totvert) {
        return;
    }

    // some sanity checks
    if (static_cast<size_t> ( mesh->totface ) > mesh->mface.size() ){
        ThrowException("Number of faces is larger than the corresponding array");
    }

    if (static_cast<size_t> ( mesh->totvert ) > mesh->mvert.size()) {
        ThrowException("Number of vertices is larger than the corresponding array");
    }

    if (static_cast<size_t> ( mesh->totloop ) > mesh->mloop.size()) {
        ThrowException("Number of vertices is larger than the corresponding array");
    }

    // collect per-submesh numbers
    std::map<int,size_t> per_mat;
    std::map<int,size_t> per_mat_verts;
    for (int i = 0; i < mesh->totface; ++i) {

        const MFace& mf = mesh->mface[i];
        per_mat[ mf.mat_nr ]++;
        per_mat_verts[ mf.mat_nr ] += mf.v4?4:3;
    }

    for (int i = 0; i < mesh->totpoly; ++i) {
        const MPoly& mp = mesh->mpoly[i];
        per_mat[ mp.mat_nr ]++;
        per_mat_verts[ mp.mat_nr ] += mp.totloop;
    }

    // ... and allocate the corresponding meshes
    const size_t old = temp->size();
    temp->reserve(temp->size() + per_mat.size());

    std::map<size_t,size_t> mat_num_to_mesh_idx;
    for(MyPair& it : per_mat) {

        mat_num_to_mesh_idx[it.first] = temp->size();
        temp->push_back(new aiMesh());

        aiMesh* out = temp->back();
        out->mVertices = new aiVector3D[per_mat_verts[it.first]];
        out->mNormals  = new aiVector3D[per_mat_verts[it.first]];

        //out->mNumFaces = 0
        //out->mNumVertices = 0
        out->mFaces = new aiFace[it.second]();

        // all sub-meshes created from this mesh are named equally. this allows
        // curious users to recover the original adjacency.
        out->mName = aiString(mesh->id.name+2);
            // skip over the name prefix 'ME'

        // resolve the material reference and add this material to the set of
        // output materials. The (temporary) material index is the index
        // of the material entry within the list of resolved materials.
        if (mesh->mat) {

            if (static_cast<size_t> ( it.first ) >= mesh->mat.size() ) {
                ThrowException("Material index is out of range");
            }

            std::shared_ptr<Material> mat = mesh->mat[it.first];
            const std::deque< std::shared_ptr<Material> >::iterator has = std::find(
                    conv_data.materials_raw.begin(),
                    conv_data.materials_raw.end(),mat
            );

            if (has != conv_data.materials_raw.end()) {
                out->mMaterialIndex = static_cast<unsigned int>( std::distance(conv_data.materials_raw.begin(),has));
            }
            else {
                out->mMaterialIndex = static_cast<unsigned int>( conv_data.materials_raw.size() );
                conv_data.materials_raw.push_back(mat);
            }
        }
        else out->mMaterialIndex = static_cast<unsigned int>( -1 );
    }

    for (int i = 0; i < mesh->totface; ++i) {

        const MFace& mf = mesh->mface[i];

        aiMesh* const out = temp[ mat_num_to_mesh_idx[ mf.mat_nr ] ];
        aiFace& f = out->mFaces[out->mNumFaces++];

        f.mIndices = new unsigned int[ f.mNumIndices = mf.v4?4:3 ];
        aiVector3D* vo = out->mVertices + out->mNumVertices;
        aiVector3D* vn = out->mNormals + out->mNumVertices;

        // XXX we can't fold this easily, because we are restricted
        // to the member names from the BLEND file (v1,v2,v3,v4)
        // which are assigned by the genblenddna.py script and
        // cannot be changed without breaking the entire
        // import process.

        if (mf.v1 >= mesh->totvert) {
            ThrowException("Vertex index v1 out of range");
        }
        const MVert* v = &mesh->mvert[mf.v1];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[0] = out->mNumVertices++;
        ++vo;
        ++vn;

        //  if (f.mNumIndices >= 2) {
        if (mf.v2 >= mesh->totvert) {
            ThrowException("Vertex index v2 out of range");
        }
        v = &mesh->mvert[mf.v2];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[1] = out->mNumVertices++;
        ++vo;
        ++vn;

        if (mf.v3 >= mesh->totvert) {
            ThrowException("Vertex index v3 out of range");
        }
        //  if (f.mNumIndices >= 3) {
        v = &mesh->mvert[mf.v3];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[2] = out->mNumVertices++;
        ++vo;
        ++vn;

        if (mf.v4 >= mesh->totvert) {
            ThrowException("Vertex index v4 out of range");
        }
        //  if (f.mNumIndices >= 4) {
        if (mf.v4) {
            v = &mesh->mvert[mf.v4];
            vo->x = v->co[0];
            vo->y = v->co[1];
            vo->z = v->co[2];
            vn->x = v->no[0];
            vn->y = v->no[1];
            vn->z = v->no[2];
            f.mIndices[3] = out->mNumVertices++;
            ++vo;
            ++vn;

            out->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
        }
        else out->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;

        //  }
        //  }
        //  }
    }

    for (int i = 0; i < mesh->totpoly; ++i) {

        const MPoly& mf = mesh->mpoly[i];

        aiMesh* const out = temp[ mat_num_to_mesh_idx[ mf.mat_nr ] ];
        aiFace& f = out->mFaces[out->mNumFaces++];

        f.mIndices = new unsigned int[ f.mNumIndices = mf.totloop ];
        aiVector3D* vo = out->mVertices + out->mNumVertices;
        aiVector3D* vn = out->mNormals + out->mNumVertices;

        // XXX we can't fold this easily, because we are restricted
        // to the member names from the BLEND file (v1,v2,v3,v4)
        // which are assigned by the genblenddna.py script and
        // cannot be changed without breaking the entire
        // import process.
        for (int j = 0;j < mf.totloop; ++j)
        {
            const MLoop& loop = mesh->mloop[mf.loopstart + j];

            if (loop.v >= mesh->totvert) {
                ThrowException("Vertex index out of range");
            }

            const MVert& v = mesh->mvert[loop.v];

            vo->x = v.co[0];
            vo->y = v.co[1];
            vo->z = v.co[2];
            vn->x = v.no[0];
            vn->y = v.no[1];
            vn->z = v.no[2];
            f.mIndices[j] = out->mNumVertices++;

            ++vo;
            ++vn;

        }
        if (mf.totloop == 3)
        {
            out->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
        }
        else
        {
            out->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
        }
    }

    // TODO should we create the TextureUVMapping map in Convert<Material> to prevent redundant processing?

    // create texture <-> uvname mapping for all materials
    // key is texture number, value is data *
    typedef std::map<uint32_t, const MLoopUV *> TextureUVMapping;
    // key is material number, value is the TextureUVMapping for the material
    typedef std::map<uint32_t, TextureUVMapping> MaterialTextureUVMappings;
    MaterialTextureUVMappings matTexUvMappings;
    const uint32_t maxMat = static_cast<const uint32_t>(mesh->mat.size());
    for (uint32_t m = 0; m < maxMat; ++m) {
        // get material by index
        const std::shared_ptr<Material> pMat = mesh->mat[m];
        TextureUVMapping texuv;
        const uint32_t maxTex = sizeof(pMat->mtex) / sizeof(pMat->mtex[0]);
        for (uint32_t t = 0; t < maxTex; ++t) {
            if (pMat->mtex[t] && pMat->mtex[t]->uvname[0]) {
                // get the CustomData layer for given uvname and correct type
                const ElemBase *pLoop = getCustomDataLayerData(mesh->ldata, CD_MLOOPUV, pMat->mtex[t]->uvname);
                if (pLoop) {
                    texuv.insert(std::make_pair(t, dynamic_cast<const MLoopUV *>(pLoop)));
                }
            }
        }
        if (texuv.size()) {
            matTexUvMappings.insert(std::make_pair(m, texuv));
        }
    }

    // collect texture coordinates, they're stored in a separate per-face buffer
    if (mesh->mtface || mesh->mloopuv) {
        if (mesh->totface > static_cast<int> ( mesh->mtface.size())) {
            ThrowException("Number of UV faces is larger than the corresponding UV face array (#1)");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);
            const auto itMatTexUvMapping = matTexUvMappings.find((*it)->mMaterialIndex);
            if (itMatTexUvMapping == matTexUvMappings.end()) {
                // default behaviour like before
                (*it)->mTextureCoords[0] = new aiVector3D[(*it)->mNumVertices];
            }
            else {
                // create texture coords for every mapped tex
                for (uint32_t i = 0; i < itMatTexUvMapping->second.size(); ++i) {
                    (*it)->mTextureCoords[i] = new aiVector3D[(*it)->mNumVertices];
                }
            }
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {
            const MTFace* v = &mesh->mtface[i];

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
            for (unsigned int i = 0; i < f.mNumIndices; ++i,++vo,++out->mNumVertices) {
                vo->x = v->uv[i][0];
                vo->y = v->uv[i][1];
            }
        }

        for (int i = 0; i < mesh->totpoly; ++i) {
            const MPoly& v = mesh->mpoly[i];
            aiMesh* const out = temp[ mat_num_to_mesh_idx[ v.mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            const auto itMatTexUvMapping = matTexUvMappings.find(v.mat_nr);
            if (itMatTexUvMapping == matTexUvMappings.end()) {
                // old behavior
                aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
                for (unsigned int j = 0; j < f.mNumIndices; ++j, ++vo, ++out->mNumVertices) {
                    const MLoopUV& uv = mesh->mloopuv[v.loopstart + j];
                    vo->x = uv.uv[0];
                    vo->y = uv.uv[1];
                }
            }
            else {
                // create textureCoords for every mapped tex
                for (uint32_t m = 0; m < itMatTexUvMapping->second.size(); ++m) {
                    const MLoopUV *tm = itMatTexUvMapping->second[m];
                    aiVector3D* vo = &out->mTextureCoords[m][out->mNumVertices];
                    uint32_t j = 0;
                    for (; j < f.mNumIndices; ++j, ++vo) {
                        const MLoopUV& uv = tm[v.loopstart + j];
                        vo->x = uv.uv[0];
                        vo->y = uv.uv[1];
                    }
                    // only update written mNumVertices in last loop
                    // TODO why must the numVertices be incremented here?
                    if (m == itMatTexUvMapping->second.size() - 1) {
                        out->mNumVertices += j;
                    }
                }
            }
        }
    }

    // collect texture coordinates, old-style (marked as deprecated in current blender sources)
    if (mesh->tface) {
        if (mesh->totface > static_cast<int> ( mesh->tface.size())) {
            ThrowException("Number of faces is larger than the corresponding UV face array (#2)");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);

            (*it)->mTextureCoords[0] = new aiVector3D[(*it)->mNumVertices];
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {
            const TFace* v = &mesh->tface[i];

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
            for (unsigned int i = 0; i < f.mNumIndices; ++i,++vo,++out->mNumVertices) {
                vo->x = v->uv[i][0];
                vo->y = v->uv[i][1];
            }
        }
    }

    // collect vertex colors, stored separately as well
    if (mesh->mcol || mesh->mloopcol) {
        if (mesh->totface > static_cast<int> ( (mesh->mcol.size()/4)) ) {
            ThrowException("Number of faces is larger than the corresponding color face array");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);

            (*it)->mColors[0] = new aiColor4D[(*it)->mNumVertices];
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiColor4D* vo = &out->mColors[0][out->mNumVertices];
            for (unsigned int n = 0; n < f.mNumIndices; ++n, ++vo,++out->mNumVertices) {
                const MCol* col = &mesh->mcol[(i<<2)+n];

                vo->r = col->r;
                vo->g = col->g;
                vo->b = col->b;
                vo->a = col->a;
            }
            for (unsigned int n = f.mNumIndices; n < 4; ++n);
        }

        for (int i = 0; i < mesh->totpoly; ++i) {
            const MPoly& v = mesh->mpoly[i];
            aiMesh* const out = temp[ mat_num_to_mesh_idx[ v.mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiColor4D* vo = &out->mColors[0][out->mNumVertices];
			const ai_real scaleZeroToOne = 1.f/255.f;
            for (unsigned int j = 0; j < f.mNumIndices; ++j,++vo,++out->mNumVertices) {
                const MLoopCol& col = mesh->mloopcol[v.loopstart + j];
                vo->r = ai_real(col.r) * scaleZeroToOne;
                vo->g = ai_real(col.g) * scaleZeroToOne;
                vo->b = ai_real(col.b) * scaleZeroToOne;
                vo->a = ai_real(col.a) * scaleZeroToOne;
            }

        }

    }

    return;
}